

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

stream * init_stream(uint16_t size)

{
  long lVar1;
  stream *psVar2;
  uint8_t *puVar3;
  undefined6 in_register_0000003a;
  ulong nmemb;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (stream *)lrtr_calloc(0x20,1);
  nmemb = CONCAT62(in_register_0000003a,size) & 0xffffffff;
  puVar3 = (uint8_t *)lrtr_calloc(nmemb,1);
  psVar2->stream = puVar3;
  psVar2->start = puVar3;
  psVar2->size = nmemb;
  psVar2->w_head = 0;
  psVar2->r_head = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct stream *init_stream(uint16_t size)
{
	struct stream *s = lrtr_calloc(sizeof(struct stream), 1);

	s->stream = lrtr_calloc(size, 1);
	s->start = s->stream;
	s->size = size;
	s->w_head = 0;
	s->r_head = 0;
	return s;
}